

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O1

err_t stb99ParamsVal(stb99_params *params)

{
  bool_t bVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  u64 *dest;
  u64 *dest_00;
  qr_o *r;
  size_t sVar9;
  size_t *psVar10;
  void *stack;
  err_t eVar11;
  ulong m;
  size_t m_00;
  ulong n;
  ulong count;
  ulong no;
  
  bVar1 = memIsValid(params,0x3d0);
  if (bVar1 == 0) {
    eVar11 = 0x6d;
  }
  else {
    psVar10 = _ls;
    lVar3 = 0;
    do {
      if (*psVar10 == params->l) goto LAB_00143f82;
      lVar3 = lVar3 + 1;
      psVar10 = psVar10 + 1;
    } while (lVar3 != 10);
    lVar3 = 10;
LAB_00143f82:
    eVar11 = 0x1f6;
    if ((lVar3 != 10) && (sVar9 = params->r, _rs[lVar3] == sVar9)) {
      n = params->l + 0x3f >> 6;
      no = params->l + 7 >> 3;
      m = sVar9 + 0x3f >> 6;
      sVar4 = zmMontCreate_keep(no);
      sVar5 = priIsPrime_deep(n);
      sVar6 = zzDiv_deep(n,m);
      sVar7 = zmMontCreate_deep(no);
      m_00 = (n - m) + 1;
      sVar8 = zmMontCreate_deep(no);
      sVar8 = qrPower_deep(n,m_00,sVar8);
      sVar5 = utilMax(4,sVar5,sVar6,sVar7,sVar8);
      dest = (u64 *)blobCreate(sVar5 + sVar4 + n * 0x18 + 8);
      if (dest == (u64 *)0x0) {
        eVar11 = 0x6e;
      }
      else {
        sVar4 = zmMontCreate_keep(no);
        u64From(dest,params->p,no);
        sVar5 = 0x134 - no;
        bVar1 = memIsZero(params->p + no,sVar5);
        eVar11 = 0x1f6;
        if (bVar1 != 0) {
          sVar6 = wwBitSize(dest,n);
          if (sVar6 == params->l) {
            dest_00 = dest + n;
            r = (qr_o *)(dest_00 + n * 2 + 1);
            stack = (void *)((long)&(r->hdr).keep + sVar4);
            bVar1 = priIsPrime(dest,n,stack);
            if (bVar1 != 0) {
              count = sVar9 + 7 >> 3;
              u64From(dest_00,params->q,count);
              bVar1 = memIsZero(params->q + count,0x21 - count);
              if (bVar1 != 0) {
                sVar9 = wwBitSize(dest_00,m);
                if (sVar9 == params->r) {
                  bVar1 = priIsPrime(dest_00,m,stack);
                  if (bVar1 != 0) {
                    zzSubW2(dest,n,1);
                    zzDiv(dest_00 + m,dest,dest,n,dest_00,m,stack);
                    bVar1 = wwIsZero(dest,m);
                    if (bVar1 != 0) {
                      zmMontCreate(r,params->p,no,params->l + 2,stack);
                      bVar1 = memIsZero(params->d + no,sVar5);
                      if (bVar1 != 0) {
                        iVar2 = (*(code *)dest_00[n * 2 + 9])(dest,params->d,r,stack);
                        if (iVar2 != 0) {
                          qrPower(dest,dest,dest_00 + m,m_00,r,stack);
                          bVar1 = wwEq(dest,(word *)dest_00[n * 2 + 5],dest_00[n * 2 + 7]);
                          if (bVar1 == 0) {
                            u64From(dest_00 + n + 1,params->a,no);
                            bVar1 = memIsZero(params->a + no,sVar5);
                            if (bVar1 != 0) {
                              bVar1 = wwEq(dest_00 + n + 1,dest,n);
                              eVar11 = 0x1f6;
                              if (bVar1 != 0) {
                                eVar11 = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        blobClose(dest);
      }
    }
  }
  return eVar11;
}

Assistant:

err_t stb99ParamsVal(const stb99_params* params)
{
	size_t n, no;
	size_t m, mo;
	// состояние 
	void* state;
	word* p;
	word* q;
	word* t;
	word* d;
	word* a;
	qr_o* qr;
	void* stack;
	// проверить указатели
	if (!memIsValid(params, sizeof(stb99_params)))
		return ERR_BAD_INPUT;
	// проверить размерности
	for (n = 0; n < COUNT_OF(_ls); ++n)
		if (_ls[n] == params->l)
			break;
	if (n == COUNT_OF(_ls) || _rs[n] != params->r)
		return ERR_BAD_PARAMS;
	// размерности
	n = W_OF_B(params->l), no = O_OF_B(params->l);
	m = W_OF_B(params->r), mo = O_OF_B(params->r);
	// создать состояние
	state = blobCreate(
		O_OF_W(3 * n + 1) + zmMontCreate_keep(no) +  
		utilMax(4,
			priIsPrime_deep(n),
			zzDiv_deep(n, m),
			zmMontCreate_deep(no),
			qrPower_deep(n, n - m + 1, zmMontCreate_deep(no))));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	p = d = (word*)state;
	q = p + n;
	t = q + m;
	a = t + n - m + 1;
	qr = (qr_o*)(a + n);
	stack = (octet*)qr + zmMontCreate_keep(no);
	// p -- l-битовое простое?
	wwFrom(p, params->p, no);
	if (!memIsZero(params->p + no, sizeof(params->p) - no) ||
		wwBitSize(p, n) != params->l || !priIsPrime(p, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// q -- r-битовое простое?
	wwFrom(q, params->q, mo);
	if (!memIsZero(params->q + mo, sizeof(params->q) - mo) ||
		wwBitSize(q, m) != params->r || !priIsPrime(q, m, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// t <- (p - 1) div q
	zzSubW2(p, n, 1);
	zzDiv(t, p, p, n, q, m, stack);
	// q | p - 1?
	if (!wwIsZero(p, m))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// построить кольцо Монтгомери
	zmMontCreate(qr, params->p, no, params->l + 2, stack);
	// загрузить d
	if (!memIsZero(params->d + no, sizeof(params->d) - no) ||
		!qrFrom(d, params->d, qr, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// d <- d^((p - 1)/q) \neq e?
	qrPower(d, d, t, n - m + 1, qr, stack);
	if (qrIsUnity(d, qr))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// a == params->a?
	wwFrom(a, params->a, no);
	if (!memIsZero(params->a + no, sizeof(params->a) - no) ||
		!wwEq(a, d, n))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// все нормально
	blobClose(state);
	return ERR_OK;
}